

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

void __thiscall
simple_thread_pool::TaskHandle::TaskHandle
          (TaskHandle *this,ThreadPoolMgrBase *m,TaskHandler *h,uint64_t interval_us,TaskType tt)

{
  this->type = tt;
  this->mgr = m;
  (this->tRegistered).__d.__r = 0;
  (this->tRegisteredLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tRegisteredLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tRegisteredLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->tRegisteredLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->tRegisteredLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->intervalUs = interval_us;
  std::function<void_(const_simple_thread_pool::TaskResult_&)>::function(&this->handler,h);
  (this->status)._M_i = WAITING;
  reschedule(this,this->intervalUs);
  return;
}

Assistant:

TaskHandle(ThreadPoolMgrBase* m,
               const TaskHandler& h,
               uint64_t interval_us,
               TaskType tt)
        : type(tt)
        , mgr(m)
        , intervalUs(interval_us)
        , handler(h)
        , status(WAITING)
    {
        reschedule(intervalUs);
    }